

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_new_window_position(int x,int y)

{
  long lVar1;
  long *plVar2;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if (lVar1 != 0) {
    *(int *)(lVar1 + 0xc) = x;
    *(int *)(lVar1 + 0x10) = y;
  }
  return;
}

Assistant:

void al_set_new_window_position(int x, int y)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_window_x = x;
   tls->new_window_y = y;
}